

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O2

int xdtoi(int c)

{
  ushort **ppuVar1;
  int iVar2;
  
  ppuVar1 = __ctype_b_loc();
  iVar2 = -0x30;
  if (((*ppuVar1)[c] >> 0xb & 1) == 0) {
    iVar2 = (uint)(((*ppuVar1)[c] >> 9 & 1) == 0) * 0x20 + -0x57;
  }
  return c + iVar2;
}

Assistant:

static inline int
xdtoi(c)
	register int c;
{
	if (isdigit(c))
		return c - '0';
	else if (islower(c))
		return c - 'a' + 10;
	else
		return c - 'A' + 10;
}